

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O0

void __thiscall
DSectorScrollInterpolation::Serialize(DSectorScrollInterpolation *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  FSerializer *arc_local;
  DSectorScrollInterpolation *this_local;
  
  DInterpolation::Serialize(&this->super_DInterpolation,arc);
  pFVar1 = FSerializer::operator()(arc,"sector",(sector_t **)&this->sector);
  pFVar1 = FSerializer::operator()(pFVar1,"ceiling",&this->ceiling);
  pFVar1 = FSerializer::operator()(pFVar1,"oldx",&this->oldx);
  FSerializer::operator()(pFVar1,"oldy",&this->oldy);
  return;
}

Assistant:

void DSectorScrollInterpolation::Serialize(FSerializer &arc)
{
	Super::Serialize(arc);
	arc("sector", sector)
		("ceiling", ceiling)
		("oldx", oldx)
		("oldy", oldy);
}